

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

shared_ptr<QPDFLogger> __thiscall QPDF::getLogger(QPDF *this)

{
  pointer pMVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_> *in_RSI;
  shared_ptr<QPDFLogger> sVar2;
  QPDF *this_local;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(in_RSI);
  std::shared_ptr<QPDFLogger>::shared_ptr((shared_ptr<QPDFLogger> *)this,&pMVar1->log);
  sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFLogger>)sVar2.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFLogger>
QPDF::getLogger()
{
    return m->log;
}